

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

EventTriggerStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::EventTriggerStatement,slang::ast::Expression_const&,slang::ast::TimingControl_const*&,bool&,slang::SourceRange>
          (BumpAllocator *this,Expression *args,TimingControl **args_1,bool *args_2,
          SourceRange *args_3)

{
  bool bVar1;
  TimingControl *pTVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  EventTriggerStatement *pEVar5;
  
  pEVar5 = (EventTriggerStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EventTriggerStatement *)this->endPtr < pEVar5 + 1) {
    pEVar5 = (EventTriggerStatement *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pEVar5 + 1);
  }
  pTVar2 = *args_1;
  bVar1 = *args_2;
  SVar3 = args_3->startLoc;
  SVar4 = args_3->endLoc;
  (pEVar5->super_Statement).kind = EventTrigger;
  (pEVar5->super_Statement).syntax = (StatementSyntax *)0x0;
  (pEVar5->super_Statement).sourceRange.startLoc = SVar3;
  (pEVar5->super_Statement).sourceRange.endLoc = SVar4;
  pEVar5->target = args;
  pEVar5->timing = pTVar2;
  pEVar5->isNonBlocking = bVar1;
  return pEVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }